

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arch_specific.cc
# Opt level: O0

char * highwayhash::TargetName(TargetBits target_bit)

{
  char *pcStack_10;
  TargetBits target_bit_local;
  
  switch(target_bit) {
  case 1:
    pcStack_10 = "Portable";
    break;
  case 2:
    pcStack_10 = "SSE41";
    break;
  default:
    pcStack_10 = (char *)0x0;
    break;
  case 4:
    pcStack_10 = "AVX2";
    break;
  case 8:
    pcStack_10 = "VSX";
    break;
  case 0x10:
    pcStack_10 = "NEON";
  }
  return pcStack_10;
}

Assistant:

const char* TargetName(const TargetBits target_bit) {
  switch (target_bit) {
    case HH_TARGET_Portable:
      return "Portable";
    case HH_TARGET_SSE41:
      return "SSE41";
    case HH_TARGET_AVX2:
      return "AVX2";
    case HH_TARGET_VSX:
      return "VSX";
    case HH_TARGET_NEON:
      return "NEON";
    default:
      return nullptr;  // zero, multiple, or unknown bits
  }
}